

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.c
# Opt level: O0

int wally_hex_to_bytes(char *hex,uchar *bytes_out,size_t len,size_t *written)

{
  _Bool _Var1;
  undefined8 local_40;
  size_t bytes_len;
  size_t *written_local;
  size_t len_local;
  uchar *bytes_out_local;
  char *hex_local;
  
  if (hex == (char *)0x0) {
    local_40 = 0;
  }
  else {
    local_40 = strlen(hex);
  }
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  if ((((hex == (char *)0x0) || (bytes_out == (uchar *)0x0)) || (len == 0)) || ((local_40 & 1) != 0)
     ) {
    hex_local._4_4_ = -2;
  }
  else if (len < local_40 >> 1) {
    if (written != (size_t *)0x0) {
      *written = local_40 >> 1;
    }
    hex_local._4_4_ = 0;
  }
  else {
    _Var1 = hex_decode(hex,local_40,bytes_out,local_40 >> 1);
    if (_Var1) {
      if (written != (size_t *)0x0) {
        *written = local_40 >> 1;
      }
      hex_local._4_4_ = 0;
    }
    else {
      hex_local._4_4_ = -2;
    }
  }
  return hex_local._4_4_;
}

Assistant:

int wally_hex_to_bytes(const char *hex,
                       unsigned char *bytes_out, size_t len, size_t *written)
{
    size_t bytes_len = hex ? strlen(hex) : 0;

    if (written)
        *written = 0;

    if (!hex || !bytes_out || !len || bytes_len & 0x1)
        return WALLY_EINVAL;

    if (len < bytes_len / 2) {
        if (written)
            *written = bytes_len / 2;
        return WALLY_OK; /* Not enough room in bytes_out, or empty string */
    }

    len = bytes_len / 2; /* hex_decode expects exact length */
    if (!hex_decode(hex, bytes_len, bytes_out, len))
        return WALLY_EINVAL;

    if (written)
        *written = len;

    return WALLY_OK;
}